

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O0

ON_Annotation * ON_Annotation::Cast(ON_Object *p)

{
  bool bVar1;
  ON_Annotation *local_18;
  ON_Object *p_local;
  
  if ((p == (ON_Object *)0x0) ||
     (bVar1 = ON_Object::IsKindOf(p,&m_ON_Annotation_class_rtti), local_18 = (ON_Annotation *)p,
     !bVar1)) {
    local_18 = (ON_Annotation *)0x0;
  }
  return local_18;
}

Assistant:

ON::AnnotationType ON::AnnotationTypeFromUnsigned( 
  unsigned int annotation_type_as_unsigned
)
{
  switch (annotation_type_as_unsigned)
  {
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Unset);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Aligned);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Angular);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Diameter);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Radius);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Rotated);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Ordinate);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::ArcLen);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::CenterMark);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Text);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Leader);
  ON_ENUM_FROM_UNSIGNED_CASE(ON::AnnotationType::Angular3pt);
  }
  ON_ERROR("Invalid annotation_type_as_unsigned parameter");
  return ON::AnnotationType::Unset;
}